

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literals * wasm::Literal::makeZeros(Literals *__return_storage_ptr__,Type type)

{
  bool bVar1;
  Iterator IVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  Literal local_78;
  Type *local_60;
  Type *t;
  Iterator __end1;
  undefined1 local_38 [8];
  Iterator __begin1;
  Type *__range1;
  Type local_18;
  Type type_local;
  Literals *zeroes;
  
  local_18.id = type.id;
  type_local.id = (uintptr_t)__return_storage_ptr__;
  bVar1 = wasm::Type::isConcrete(&local_18);
  if (bVar1) {
    Literals::Literals(__return_storage_ptr__);
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)&local_18;
    IVar2 = wasm::Type::begin((Type *)__begin1.
                                      super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                      .index);
    __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)IVar2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    local_38 = (undefined1  [8])
               IVar2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent;
    PVar3 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
            wasm::Type::end((Type *)__begin1.
                                    super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>
                                    .index);
    while( true ) {
      __end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
           (Type *)PVar3.index;
      t = PVar3.parent;
      bVar1 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                        ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_38,
                         (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)&t);
      if (!bVar1) break;
      local_60 = wasm::Type::Iterator::operator*((Iterator *)local_38);
      makeZero(&local_78,(Type)local_60->id);
      SmallVector<wasm::Literal,_1UL>::push_back
                (&__return_storage_ptr__->super_SmallVector<wasm::Literal,_1UL>,&local_78);
      ~Literal(&local_78);
      ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
                ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)local_38);
      PVar3.index = (size_t)__end1.
                            super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                            parent;
      PVar3.parent = t;
    }
    return __return_storage_ptr__;
  }
  __assert_fail("type.isConcrete()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                ,0xe5,"static Literals wasm::Literal::makeZeros(Type)");
}

Assistant:

Literals Literal::makeZeros(Type type) {
  assert(type.isConcrete());
  Literals zeroes;
  for (const auto& t : type) {
    zeroes.push_back(makeZero(t));
  }
  return zeroes;
}